

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O2

char * curl_easy_escape(Curl_easy *data,char *string,int inlength)

{
  byte bVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  ulong local_50;
  
  if (inlength == 0) {
    sVar6 = strlen(string);
  }
  else {
    sVar6 = (size_t)inlength;
  }
  sVar5 = sVar6 + 1;
  pcVar2 = (char *)(*Curl_cmalloc)(sVar5);
  if (pcVar2 == (char *)0x0) {
LAB_001277cb:
    pcVar2 = (char *)0x0;
  }
  else {
    lVar4 = 0;
    local_50 = sVar5;
    for (sVar7 = 0; sVar6 != sVar7; sVar7 = sVar7 + 1) {
      bVar1 = string[sVar7];
      switch(bVar1) {
      case 0x2d:
      case 0x2e:
      case 0x30:
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x38:
      case 0x39:
      case 0x41:
      case 0x42:
      case 0x43:
      case 0x44:
      case 0x45:
      case 0x46:
      case 0x47:
      case 0x48:
      case 0x49:
      case 0x4a:
      case 0x4b:
      case 0x4c:
      case 0x4d:
      case 0x4e:
      case 0x4f:
      case 0x50:
      case 0x51:
      case 0x52:
      case 0x53:
      case 0x54:
      case 0x55:
      case 0x56:
      case 0x57:
      case 0x58:
      case 0x59:
      case 0x5a:
      case 0x5f:
      case 0x61:
      case 0x62:
      case 99:
      case 100:
      case 0x65:
      case 0x66:
      case 0x67:
      case 0x68:
      case 0x69:
      case 0x6a:
      case 0x6b:
      case 0x6c:
      case 0x6d:
      case 0x6e:
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x72:
      case 0x73:
      case 0x74:
      case 0x75:
      case 0x76:
      case 0x77:
      case 0x78:
      case 0x79:
      case 0x7a:
      case 0x7e:
        pcVar2[lVar4] = bVar1;
        lVar4 = lVar4 + 1;
        break;
      default:
        sVar5 = sVar5 + 2;
        pcVar3 = pcVar2;
        if (local_50 < sVar5) {
          local_50 = local_50 * 2;
          pcVar3 = (char *)(*Curl_crealloc)(pcVar2,local_50);
          if (pcVar3 == (char *)0x0) {
            (*Curl_cfree)(pcVar2);
            goto LAB_001277cb;
          }
        }
        curl_msnprintf(pcVar3 + lVar4,4,"%%%02X",(ulong)bVar1);
        lVar4 = lVar4 + 3;
        pcVar2 = pcVar3;
      }
    }
    pcVar2[lVar4] = '\0';
  }
  return pcVar2;
}

Assistant:

char *curl_easy_escape(struct Curl_easy *data, const char *string,
                       int inlength)
{
  size_t alloc = (inlength?(size_t)inlength:strlen(string))+1;
  char *ns;
  char *testing_ptr = NULL;
  unsigned char in; /* we need to treat the characters unsigned */
  size_t newlen = alloc;
  size_t strindex=0;
  size_t length;
  CURLcode result;

  ns = malloc(alloc);
  if(!ns)
    return NULL;

  length = alloc-1;
  while(length--) {
    in = *string;

    if(Curl_isunreserved(in))
      /* just copy this */
      ns[strindex++]=in;
    else {
      /* encode it */
      newlen += 2; /* the size grows with two, since this'll become a %XX */
      if(newlen > alloc) {
        alloc *= 2;
        testing_ptr = realloc(ns, alloc);
        if(!testing_ptr) {
          free(ns);
          return NULL;
        }
        else {
          ns = testing_ptr;
        }
      }

      result = Curl_convert_to_network(data, &in, 1);
      if(result) {
        /* Curl_convert_to_network calls failf if unsuccessful */
        free(ns);
        return NULL;
      }

      snprintf(&ns[strindex], 4, "%%%02X", in);

      strindex+=3;
    }
    string++;
  }
  ns[strindex]=0; /* terminate it */
  return ns;
}